

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# presagearchive.c
# Opt level: O3

void PresageArchive_Close(PresageArchive *archive)

{
  ulong uVar1;
  
  if (archive != (PresageArchive *)0x0) {
    if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
      PRX_Close((archive->archive).prx);
    }
    else if (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
      PRDPRS_Close((archive->archive).prdprs);
    }
    if (archive->n_entries != 0) {
      uVar1 = 0;
      do {
        PresageArchiveMember_Free(archive->members[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < archive->n_entries);
    }
    free(archive);
    return;
  }
  return;
}

Assistant:

void
PresageArchive_Close(PresageArchive *archive)
{
	if (!archive) return;

	switch (archive->kind) {
	case PRESAGE_ARCHIVE_KIND_PRDPRS:
		PRDPRS_Close(archive->archive.prdprs);
		break;
	case PRESAGE_ARCHIVE_KIND_PRX:
		PRX_Close(archive->archive.prx);
		break;
	}

	for (int i = 0; i < archive->n_entries; i++) {
		PresageArchiveMember_Free(archive->members[i]);
	}

	free(archive);
}